

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall
kj::ExceptionCallback::RootExceptionCallback::logMessage
          (RootExceptionCallback *this,LogSeverity severity,char *file,int line,int contextDepth,
          String *text)

{
  size_t sVar1;
  ssize_t sVar2;
  char *__buf;
  ulong uVar3;
  char *in_stack_ffffffffffffff98;
  undefined1 local_59;
  int line_local;
  LogSeverity severity_local;
  Array<char> local_50;
  char *file_local;
  kj local_30 [8];
  long local_28;
  
  local_28 = (long)contextDepth;
  local_30[0] = (kj)0x5f;
  local_59 = 10;
  line_local = line;
  severity_local = severity;
  file_local = file;
  str<kj::Repeat<char>,char_const*&,char_const(&)[2],int&,char_const(&)[3],kj::LogSeverity&,char_const(&)[3],kj::String,char>
            ((String *)&local_50,local_30,(Repeat<char> *)&file_local,(char **)0x2b1400,
             (char (*) [2])&line_local,(int *)0x28b644,(char (*) [3])&severity_local,
             (LogSeverity *)0x28b644,(char (*) [3])text,(String *)&local_59,
             in_stack_ffffffffffffff98);
  Array<char>::operator=(&text->content,&local_50);
  Array<char>::~Array(&local_50);
  sVar1 = (text->content).size_;
  if (sVar1 == 0) {
    __buf = "";
  }
  else {
    __buf = (text->content).ptr;
  }
  uVar3 = sVar1 + (sVar1 == 0);
  while( true ) {
    if (uVar3 < 2) {
      return;
    }
    sVar2 = ::write(2,__buf,uVar3 - 1);
    if (sVar2 < 1) break;
    __buf = __buf + sVar2;
    uVar3 = uVar3 - sVar2;
  }
  return;
}

Assistant:

void logMessage(LogSeverity severity, const char* file, int line, int contextDepth,
                  String&& text) override {
    text = str(kj::repeat('_', contextDepth), file, ":", line, ": ", severity, ": ",
               mv(text), '\n');

    StringPtr textPtr = text;

    while (textPtr != nullptr) {
      miniposix::ssize_t n = miniposix::write(STDERR_FILENO, textPtr.begin(), textPtr.size());
      if (n <= 0) {
        // stderr is broken.  Give up.
        return;
      }
      textPtr = textPtr.slice(n);
    }
  }